

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

void pbrt::ParallelFor(int64_t start,int64_t end,function<void_(long,_long)> *func)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  ThreadPool *in_RSI;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock;
  ParallelForLoop1D loop;
  int64_t chunkSize;
  function<void_(long,_long)> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  long in_stack_ffffffffffffff08;
  unique_lock<std::mutex> *lock_00;
  function<void_(long,_long)> *in_stack_ffffffffffffff10;
  ThreadPool *this;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar5;
  ParallelForLoop1D *this_00;
  char (*in_stack_ffffffffffffff40) [11];
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  _func_int **in_stack_ffffffffffffff58;
  LogLevel in_stack_ffffffffffffff64;
  long local_30 [2];
  long local_20;
  ThreadPool *local_10;
  unique_lock<std::mutex> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_> *)
                     0x5c71b0);
  if (!bVar1) {
    LogFatal<char_const(&)[11]>
              (in_stack_ffffffffffffff64,(char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54
               ,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  local_30[1] = 1;
  lVar3 = (long)local_10 - (long)local_8;
  iVar2 = RunningThreads();
  local_30[0] = lVar3 / (long)(iVar2 << 3);
  plVar4 = std::max<long>(local_30 + 1,local_30);
  local_20 = *plVar4;
  if ((long)local_10 - (long)local_8 < local_20) {
    std::function<void_(long,_long)>::operator()
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  }
  else {
    this_00 = (ParallelForLoop1D *)&stack0xffffffffffffff58;
    uVar5 = (undefined4)local_20;
    std::function<void_(long,_long)>::function
              ((function<void_(long,_long)> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    ParallelForLoop1D::ParallelForLoop1D
              (this_00,CONCAT44(uVar5,in_stack_ffffffffffffff18),(int64_t)local_10,
               (int)((ulong)local_8 >> 0x20),
               (function<void_(long,_long)> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x5c72d6);
    std::unique_ptr<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_>::operator->
              ((unique_ptr<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_> *)0x5c72e2);
    ThreadPool::AddToJobList
              ((ThreadPool *)CONCAT44(uVar5,in_stack_ffffffffffffff18),(ParallelJob *)local_10);
    lock_00 = local_8;
    this = local_10;
    while( true ) {
      in_stack_ffffffffffffff07 =
           ParallelJob::Finished
                     ((ParallelJob *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      if (((in_stack_ffffffffffffff07 ^ 0xff) & 1) == 0) break;
      std::unique_ptr<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_>::operator->
                ((unique_ptr<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_> *)0x5c7326);
      ThreadPool::WorkOrWait(this,lock_00);
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    ParallelForLoop1D::~ParallelForLoop1D
              ((ParallelForLoop1D *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  }
  return;
}

Assistant:

void ParallelFor(int64_t start, int64_t end, std::function<void(int64_t, int64_t)> func) {
    CHECK(threadPool);
    int64_t chunkSize = std::max<int64_t>(1, (end - start) / (8 * RunningThreads()));
    if (end - start < chunkSize) {
        func(start, end);
        return;
    }

    // Create and enqueue _ParallelJob_ for this loop
    ParallelForLoop1D loop(start, end, chunkSize, std::move(func));
    std::unique_lock<std::mutex> lock = threadPool->AddToJobList(&loop);

    // Help out with parallel loop iterations in the current thread
    while (!loop.Finished())
        threadPool->WorkOrWait(&lock);
}